

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O1

int fd_recv(int sock,int *fds,size_t nfds)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  cmsghdr *__cmsg;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  iovec iov;
  msghdr msg;
  undefined1 local_139;
  ulong local_138;
  int *local_130;
  ulong local_128;
  ulong local_120;
  int *local_118;
  size_t local_110;
  size_t local_108;
  iovec local_100;
  msghdr local_f0;
  fd_set local_b8;
  
  if (fds == (int *)0x0 || nfds == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return -1;
  }
  uVar7 = (ulong)(uint)sock;
  local_120 = 1L << ((byte)sock & 0x3f);
  local_128 = (ulong)((uint)sock >> 6);
  sVar10 = 0;
  local_138 = uVar7;
  local_118 = fds;
  local_110 = nfds;
LAB_00106664:
  uVar6 = local_110 - sVar10;
  if (0x5e7 < uVar6) {
    uVar6 = 0x5e8;
  }
  if ((int)uVar7 < 0) {
    __assert_fail("sock >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x11d,"int fd_package_recv(int, int *, size_t)");
  }
  if (local_110 == sVar10) {
    __assert_fail("nfds > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x11e,"int fd_package_recv(int, int *, size_t)");
  }
  bzero(&local_f0,0x38);
  bzero(&local_100,0x10);
  local_100.iov_base = &local_139;
  local_100.iov_len = 1;
  local_f0.msg_iovlen = 1;
  local_f0.msg_controllen = uVar6 * 0x18;
  local_f0.msg_iov = &local_100;
  local_f0.msg_control = calloc(1,local_f0.msg_controllen);
  uVar5 = local_120;
  uVar9 = local_128;
  if ((cmsghdr *)local_f0.msg_control != (cmsghdr *)0x0) {
    local_130 = fds + sVar10;
    local_108 = sVar10;
    do {
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[uVar9] = local_b8.fds_bits[uVar9] | uVar5;
      select(sock + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      sVar3 = recvmsg((int)uVar7,&local_f0,0x40000000);
      if (sVar3 != -1) {
        uVar9 = 0;
        __cmsg = (cmsghdr *)local_f0.msg_control;
        if (local_f0.msg_controllen < 0x10) {
          __cmsg = (cmsghdr *)0x0;
        }
        goto LAB_001067c9;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    goto LAB_001068a0;
  }
  iVar4 = -1;
  goto LAB_001068c7;
  while( true ) {
    if ((__cmsg->cmsg_level == 1) && (__cmsg->cmsg_type == 1)) {
      uVar7 = __cmsg->cmsg_len + 0x3fffffff0;
      uVar5 = (ulong)((int)(uVar7 >> 2) + uVar8);
      bVar11 = uVar5 <= uVar6;
      if (bVar11) {
        memmove(local_130 + uVar9,__cmsg + 1,uVar7 & 0x3fffffffc);
        __cmsg = __cmsg_nxthdr(&local_f0,__cmsg);
        uVar7 = local_138;
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        uVar5 = uVar9;
        uVar7 = local_138;
      }
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      bVar11 = false;
      uVar5 = uVar9;
    }
    uVar8 = (uint)uVar5;
    uVar9 = uVar5;
    if (!bVar11) break;
LAB_001067c9:
    uVar8 = (uint)uVar9;
    if ((__cmsg == (cmsghdr *)0x0) || (uVar6 <= uVar9)) break;
  }
  piVar2 = local_130;
  uVar9 = (ulong)uVar8;
  if ((__cmsg != (cmsghdr *)0x0) || (iVar4 = 0, uVar9 < uVar6)) {
    if (uVar9 != 0) {
      uVar5 = 0;
      do {
        if (-1 < piVar2[uVar5]) {
          close(piVar2[uVar5]);
        }
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
    }
    piVar2 = __errno_location();
    *piVar2 = 0x16;
LAB_001068a0:
    iVar4 = -1;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  free(local_f0.msg_control);
  *piVar2 = iVar1;
  fds = local_118;
  sVar10 = local_108;
LAB_001068c7:
  if (iVar4 != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if ((int)sVar10 != 0) {
      uVar7 = 0;
      do {
        close(fds[uVar7]);
        uVar7 = uVar7 + 1;
      } while ((sVar10 & 0xffffffff) != uVar7);
    }
    *piVar2 = iVar1;
    return iVar4;
  }
  sVar10 = (size_t)(uint)((int)sVar10 + (int)uVar6);
  if (local_110 <= sVar10) {
    return 0;
  }
  goto LAB_00106664;
}

Assistant:

int
fd_recv(int sock, int *fds, size_t nfds)
{
	unsigned int i, step, j;
	int ret, serrno;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_recv(sock, fds + i, step);
		if (ret != 0) {
			/* Close all received descriptors. */
			serrno = errno;
			for (j = 0; j < i; j++)
				close(fds[j]);
			errno = serrno;
			break;
		}
		i += step;
	}

	return (ret);
}